

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O1

Node * __thiscall
spoa::Graph::AddSequence
          (Graph *this,char *sequence,vector<unsigned_int,_std::allocator<unsigned_int>_> *weights,
          uint32_t begin,uint32_t end)

{
  pointer puVar1;
  pointer puVar2;
  uint uVar3;
  _Head_base<0UL,_spoa::Graph::Node_*,_false> _Var4;
  Node *head;
  ulong uVar5;
  Node *tail;
  
  uVar3 = end - begin;
  if (uVar3 != 0) {
    if (begin <= end && uVar3 != 0) {
      uVar5 = (ulong)begin;
      tail = (Node *)0x0;
      do {
        head = AddNode(this,(this->coder_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[sequence[uVar5]]);
        if (tail != (Node *)0x0) {
          puVar1 = (weights->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          AddEdge(this,tail,head,puVar1[uVar5] + puVar1[(int)uVar5 - 1]);
        }
        uVar5 = uVar5 + 1;
        tail = head;
      } while (end != uVar5);
    }
    puVar2 = (this->nodes_).
             super__Vector_base<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    _Var4._M_head_impl =
         *(Node **)&puVar2[((ulong)((long)(this->nodes_).
                                          super__Vector_base<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2)
                           >> 3) - (ulong)uVar3]._M_t.
                    super___uniq_ptr_impl<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>
                    ._M_t;
  }
  else {
    _Var4._M_head_impl = (Node *)0x0;
  }
  return _Var4._M_head_impl;
}

Assistant:

Graph::Node* Graph::AddSequence(
    const char* sequence,
    const std::vector<std::uint32_t>& weights,
    std::uint32_t begin,
    std::uint32_t end) {
  if (begin == end) {
    return nullptr;
  }
  Node* prev = nullptr;
  for (std::uint32_t i = begin; i < end; ++i) {
    auto curr = AddNode(coder_[sequence[i]]);
    if (prev) {  // both nodes contribute to the weight
      AddEdge(prev, curr, weights[i - 1] + weights[i]);
    }
    prev = curr;
  }
  return nodes_[nodes_.size() - (end - begin)].get();
}